

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_unset_nest_lock_(void **user_lock)

{
  int iVar1;
  undefined8 in_RDI;
  kmp_int32 gtid_00;
  ident_t *unaff_retaddr;
  int gtid;
  undefined4 in_stack_fffffffffffffff0;
  
  gtid_00 = (kmp_int32)((ulong)in_RDI >> 0x20);
  iVar1 = __kmp_get_global_thread_id_reg();
  if ((((((ulong)ompt_enabled & 1) != 0) && (-1 < iVar1)) &&
      (__kmp_threads[iVar1] != (kmp_info_t *)0x0)) &&
     ((__kmp_threads[iVar1]->th).ompt_thread_info.return_address == (void *)0x0)) {
    (__kmp_threads[iVar1]->th).ompt_thread_info.return_address = unaff_retaddr;
  }
  __kmpc_unset_nest_lock(unaff_retaddr,gtid_00,(void **)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_UNSET_NEST_LOCK)(void **user_lock) {
#ifdef KMP_STUB
  if (*((kmp_stub_lock_t *)user_lock) == UNINIT) {
    // TODO: Issue an error.
  }
  if (*((kmp_stub_lock_t *)user_lock) == UNLOCKED) {
    // TODO: Issue an error.
  }
  (*((int *)user_lock))--;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_unset_nest_lock(NULL, gtid, user_lock);
#endif
}